

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O1

void __thiscall arm::ConstValue::~ConstValue(ConstValue *this)

{
  anon_class_1_0_00000001 local_9;
  
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[(byte)this->field_0x28]._M_data)
            (&local_9,(variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this->field_0x8);
  this->field_0x28 = 0xff;
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~ConstValue() {}